

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<128,_512>::CollectUnmarked(ObjectBlockPool<128,_512> *this)

{
  SmallBlock<128> **ppSVar1;
  MyLargeBlock *pMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  SmallBlock<128> *pSVar6;
  uint newSize;
  FastVector<SmallBlock<128>_*,_false,_false> *this_00;
  LargeBlock<128,_512> *pLVar7;
  ulong uVar8;
  SmallBlock<128> *local_40;
  FastVector<SmallBlock<128>_*,_false,_false> *local_38;
  
  pMVar2 = this->activePages;
  if (pMVar2 != (MyLargeBlock *)0x0) {
    local_38 = &this->objectsToFree;
    uVar4 = (ulong)this->lastNum;
    pLVar7 = pMVar2;
    do {
      if ((pLVar7 != pMVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
        pSVar6 = pLVar7->page;
        uVar8 = 0;
        do {
          if ((pSVar6->marker & 3) == 0) {
            if (((uint)pSVar6->marker & 0xc) == 4) {
              newSize = (this->objectsToFinalize).count;
              this_00 = &this->objectsToFinalize;
              if (newSize != (this->objectsToFinalize).max) {
                ppSVar1 = (this->objectsToFinalize).data;
                (this->objectsToFinalize).count = newSize + 1;
LAB_00120b45:
                ppSVar1[newSize] = pSVar6;
                goto LAB_00120b49;
              }
            }
            else {
              newSize = (this->objectsToFree).count;
              this_00 = local_38;
              if (newSize != (this->objectsToFree).max) {
                ppSVar1 = (this->objectsToFree).data;
                (this->objectsToFree).count = newSize + 1;
                goto LAB_00120b45;
              }
            }
            local_40 = pSVar6;
            FastVector<SmallBlock<128>_*,_false,_false>::grow_and_add(this_00,newSize,&local_40);
          }
LAB_00120b49:
          uVar8 = uVar8 + 1;
          pMVar2 = this->activePages;
          uVar4 = (ulong)this->lastNum;
          uVar5 = 0x200;
          if (pLVar7 == pMVar2) {
            uVar5 = uVar4;
          }
          pSVar6 = pSVar6 + 1;
        } while (uVar8 < uVar5);
      }
      pLVar7 = pLVar7->next;
    } while (pLVar7 != (LargeBlock<128,_512> *)0x0);
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}